

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextedit.cpp
# Opt level: O1

void __thiscall QTextEdit::dragMoveEvent(QTextEdit *this,QDragMoveEvent *e)

{
  long lVar1;
  QWidgetTextControl *this_00;
  uint uVar2;
  LayoutDirection LVar3;
  int iVar4;
  int iVar5;
  ulong uVar6;
  ulong uVar7;
  long in_FS_OFFSET;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  QPointF local_38;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  lVar1 = *(long *)&(this->super_QAbstractScrollArea).super_QFrame.super_QWidget.field_0x8;
  auVar8._0_8_ = (double)((ulong)*(double *)(e + 0x10) & 0x8000000000000000 | 0x3fe0000000000000) +
                 *(double *)(e + 0x10);
  auVar8._8_8_ = (double)((ulong)*(double *)(e + 0x18) & 0x8000000000000000 | 0x3fe0000000000000) +
                 *(double *)(e + 0x18);
  auVar8 = minpd(_DAT_0066f5d0,auVar8);
  auVar9._8_8_ = -(ulong)(-2147483648.0 < auVar8._8_8_);
  auVar9._0_8_ = -(ulong)(-2147483648.0 < auVar8._0_8_);
  uVar2 = movmskpd((int)local_28,auVar9);
  uVar7 = 0x8000000000000000;
  if ((uVar2 & 2) != 0) {
    uVar7 = (ulong)(uint)(int)auVar8._8_8_ << 0x20;
  }
  uVar6 = 0x80000000;
  if ((uVar2 & 1) != 0) {
    uVar6 = (ulong)(uint)(int)auVar8._0_8_;
  }
  *(ulong *)(lVar1 + 0x30c) = uVar6 | uVar7;
  if (*(int *)(lVar1 + 0x308) == 0) {
    QBasicTimer::start(lVar1 + 0x308,100000000,1,this);
  }
  this_00 = *(QWidgetTextControl **)(lVar1 + 0x2f8);
  LVar3 = QWidget::layoutDirection(*(QWidget **)(lVar1 + 8));
  if (LVar3 == RightToLeft) {
    iVar4 = QAbstractSlider::maximum(*(QAbstractSlider **)(lVar1 + 0x288));
    iVar5 = QAbstractSlider::value(*(QAbstractSlider **)(lVar1 + 0x288));
    iVar4 = iVar4 - iVar5;
  }
  else {
    iVar4 = QAbstractSlider::value(*(QAbstractSlider **)(lVar1 + 0x288));
  }
  iVar5 = QAbstractSlider::value(*(QAbstractSlider **)(lVar1 + 0x290));
  local_38.yp = (qreal)iVar5;
  local_38.xp = (double)iVar4;
  QWidgetTextControl::processEvent(this_00,(QEvent *)e,&local_38,*(QWidget **)(lVar1 + 0x2b0));
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QTextEdit::dragMoveEvent(QDragMoveEvent *e)
{
    Q_D(QTextEdit);
    d->autoScrollDragPos = e->position().toPoint();
    if (!d->autoScrollTimer.isActive())
        d->autoScrollTimer.start(100, this);
    d->sendControlEvent(e);
}